

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O2

void __thiscall FString::StripRight(FString *this)

{
  char *__src;
  char *__dest;
  long lVar1;
  int iVar2;
  long lVar3;
  size_t len;
  ulong uVar4;
  FStringData *old;
  
  __src = this->Chars;
  uVar4 = (ulong)*(uint *)(__src + -0xc);
  if (uVar4 != 0) {
    lVar1 = 0;
    do {
      lVar3 = lVar1;
      if (lVar3 + uVar4 == 1) break;
      iVar2 = isspace((uint)(byte)__src[lVar3 + (uVar4 - 2)]);
      lVar1 = lVar3 + -1;
    } while (iVar2 != 0);
    if (lVar3 != 1) {
      len = lVar3 + -1 + uVar4;
      if (*(int *)(__src + -4) < 2) {
        __src[lVar3 + (uVar4 - 1)] = '\0';
        ReallocBuffer(this,len);
        return;
      }
      AllocBuffer(this,len);
      __dest = this->Chars;
      memcpy(__dest,__src,len);
      __dest[lVar3 + -1 + uVar4] = '\0';
      FStringData::Release((FStringData *)(__src + -0xc));
      return;
    }
  }
  return;
}

Assistant:

FString &FString::operator += (const FString &tail)
{
	size_t len1 = Len();
	size_t len2 = tail.Len();
	ReallocBuffer (len1 + len2);
	StrCopy (Chars + len1, tail);
	return *this;
}